

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void display_object_recall(object *obj)

{
  textblock *tb_00;
  textblock *tb;
  char header_buf [120];
  object *obj_local;
  
  header_buf._112_8_ = obj;
  tb_00 = object_info(obj,OINFO_NONE);
  object_desc((char *)&tb,0x78,(object *)header_buf._112_8_,0x43,player);
  clear_from(L'\0');
  textui_textblock_place(tb_00,(region_conflict)ZEXT816((ulong)0),(char *)&tb);
  textblock_free(tb_00);
  return;
}

Assistant:

void display_object_recall(struct object *obj)
{
	char header_buf[120];

	textblock *tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL, player);

	clear_from(0);
	textui_textblock_place(tb, SCREEN_REGION, header_buf);
	textblock_free(tb);
}